

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taggedptr.h
# Opt level: O1

SampledSpectrum __thiscall pbrt::LightHandle::Phi(LightHandle *this,SampledWavelengths *lambda)

{
  array<pbrt::Point3<float>,_4> *this_00;
  Image *this_01;
  Tuple2<pbrt::Point2,_int> TVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  ushort uVar4;
  undefined1 auVar5 [8];
  undefined8 uVar6;
  Float *pFVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  anon_class_8_1_5ef94505 phi;
  PortalImageInfiniteLight *this_02;
  Point2i PVar11;
  float fVar12;
  undefined1 auVar13 [16];
  float fVar14;
  Float FVar15;
  float fVar16;
  float fVar26;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar27;
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar36 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  SampledSpectrum SVar40;
  SampledSpectrum SVar41;
  SampledSpectrum SVar42;
  SampledSpectrum SVar43;
  SampledSpectrum SVar44;
  Float FStack_b4;
  Float FStack_b0;
  Float FStack_ac;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  undefined1 auStack_98 [8];
  undefined8 uStack_90;
  undefined1 auStack_88 [16];
  PortalImageInfiniteLight *pPStack_78;
  SampledWavelengths *pSStack_70;
  RGB RStack_68;
  undefined1 auStack_58 [8];
  float fStack_50;
  float fStack_4c;
  RGBIlluminantSpectrum RStack_48;
  undefined1 auVar28 [56];
  undefined1 auVar37 [56];
  
  auVar28 = in_ZMM1._8_56_;
  uVar9 = (this->
          super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
          ).bits;
  this_02 = (PortalImageInfiniteLight *)(uVar9 & 0xffffffffffff);
  uVar4 = (ushort)(uVar9 >> 0x30);
  if (4 < uVar9 >> 0x30) {
    if (uVar4 < 7) {
      if (uVar4 != 6) {
        fVar14 = (this_02->portal).values[3].super_Tuple3<pbrt::Point3,_float>.y;
        auVar20._4_4_ = fVar14;
        auVar20._0_4_ = fVar14;
        auVar20._8_4_ = fVar14;
        auVar20._12_4_ = fVar14;
        auVar37 = ZEXT856(auVar20._8_8_);
        SVar43 = DenselySampledSpectrum::Sample((DenselySampledSpectrum *)&this_02->portal,lambda);
        auVar39._0_8_ = SVar43.values.values._8_8_;
        auVar39._8_56_ = auVar28;
        auVar38._0_8_ = SVar43.values.values._0_8_;
        auVar38._8_56_ = auVar37;
        auVar13 = vmovlhps_avx(auVar38._0_16_,auVar39._0_16_);
        fVar16 = auVar13._0_4_ * fVar14;
        fVar26 = auVar13._4_4_ * fVar14;
        fVar27 = auVar13._8_4_ * fVar14;
        fVar14 = auVar13._12_4_ * fVar14;
        auVar21._0_4_ = fVar16 + fVar16;
        auVar21._4_4_ = fVar26 + fVar26;
        auVar21._8_4_ = fVar27 + fVar27;
        auVar21._12_4_ = fVar14 + fVar14;
        auVar13._8_4_ = 0x40490fdb;
        auVar13._0_8_ = 0x40490fdb40490fdb;
        auVar13._12_4_ = 0x40490fdb;
        auVar13 = vmulps_avx512vl(auVar21,auVar13);
        fVar14 = (this_02->portal).values[3].super_Tuple3<pbrt::Point3,_float>.z;
        fVar14 = (1.0 - fVar14) + (fVar14 - (float)((Image *)&this_02->portalFrame)->format) * 0.5;
        fVar16 = fVar14 * auVar13._0_4_;
        fVar26 = fVar14 * auVar13._4_4_;
        auVar13 = CONCAT412(fVar14 * auVar13._12_4_,
                            CONCAT48(fVar14 * auVar13._8_4_,CONCAT44(fVar26,fVar16)));
        auVar13 = vshufpd_avx(auVar13,auVar13,1);
        SVar43.values.values._8_8_ = auVar13._0_8_;
        SVar43.values.values[0] = fVar16;
        SVar43.values.values[1] = fVar26;
        return (SampledSpectrum)SVar43.values.values;
      }
      SVar43 = DiffuseAreaLight::Phi((DiffuseAreaLight *)this_02,lambda);
      return (array<float,_4>)(array<float,_4>)SVar43;
    }
    if (uVar9 >> 0x30 != 8) {
      if (uVar4 != 7) {
        pSStack_70 = lambda;
        if ((this_02->image).resolution.super_Tuple2<pbrt::Point2,_int>.y < 1) {
          _auStack_98 = ZEXT816(0);
        }
        else {
          this_01 = &this_02->image;
          lVar8 = 0;
          _auStack_98 = ZEXT816(0);
          pPStack_78 = this_02;
          do {
            auStack_88._8_8_ = lVar8;
            if (0 < (this_02->image).resolution.super_Tuple2<pbrt::Point2,_int>.x) {
              uStack_a8 = lVar8 << 0x20;
              _auStack_58 = ZEXT416((uint)((float)(int)lVar8 + 0.5));
              uVar9 = 0;
              do {
                iVar10 = 0;
                FStack_ac = 0.0;
                FStack_b0 = 0.0;
                FStack_b4 = 0.0;
                PVar11.super_Tuple2<pbrt::Point2,_int> =
                     (Tuple2<pbrt::Point2,_int>)(uStack_a8 | uVar9);
                do {
                  FVar15 = Image::GetChannel(this_01,PVar11,iVar10,(WrapMode2D)0x200000002);
                  this_02 = pPStack_78;
                  pFVar7 = &FStack_ac;
                  if (iVar10 != 0) {
                    if (iVar10 == 1) {
                      pFVar7 = &FStack_b0;
                    }
                    else {
                      pFVar7 = &FStack_b4;
                    }
                  }
                  *pFVar7 = FVar15;
                  iVar10 = iVar10 + 1;
                } while (iVar10 != 3);
                auVar20 = vinsertps_avx(ZEXT416((uint)((float)(int)uVar9 + 0.5)),
                                        ZEXT416((uint)auStack_58._0_4_),0x10);
                auVar31._8_8_ = 0;
                auVar31._0_8_ = (pPStack_78->image).resolution.super_Tuple2<pbrt::Point2,_int>;
                auVar13 = vcvtdq2ps_avx(auVar31);
                auVar13 = vdivps_avx(auVar20,auVar13);
                PortalImageInfiniteLight::RenderFromImage
                          (pPStack_78,(Point2f)auVar13._0_8_,(Float *)((long)&uStack_a0 + 4));
                auVar13 = vinsertps_avx(ZEXT416((uint)FStack_ac),ZEXT416((uint)FStack_b0),0x10);
                auVar13 = vmaxps_avx(auVar13,_DAT_00565010);
                auVar28 = ZEXT856(auVar13._8_8_);
                auVar20 = vmaxss_avx(ZEXT416((uint)FStack_b4),ZEXT416(0));
                auVar37 = ZEXT856(auVar20._8_8_);
                RStack_68._0_8_ = vmovlps_avx(auVar13);
                RStack_68.b = auVar20._0_4_;
                RGBIlluminantSpectrum::RGBIlluminantSpectrum
                          (&RStack_48,this_02->imageColorSpace,&RStack_68);
                SVar43 = RGBIlluminantSpectrum::Sample(&RStack_48,pSStack_70);
                auVar35._0_8_ = SVar43.values.values._8_8_;
                auVar35._8_56_ = auVar37;
                auVar24._0_8_ = SVar43.values.values._0_8_;
                auVar24._8_56_ = auVar28;
                auVar13 = vmovlhps_avx(auVar24._0_16_,auVar35._0_16_);
                auVar3._4_4_ = uStack_a0._4_4_;
                auVar3._0_4_ = uStack_a0._4_4_;
                auVar3._8_4_ = uStack_a0._4_4_;
                auVar3._12_4_ = uStack_a0._4_4_;
                auVar13 = vdivps_avx512vl(auVar13,auVar3);
                auStack_98._0_4_ = auVar13._0_4_ + (float)auStack_98._0_4_;
                auStack_98._4_4_ = auVar13._4_4_ + (float)auStack_98._4_4_;
                uStack_90._0_4_ = auVar13._8_4_ + (float)uStack_90;
                uStack_90._4_4_ = auVar13._12_4_ + uStack_90._4_4_;
                uVar9 = uVar9 + 1;
              } while ((long)uVar9 <
                       (long)(this_02->image).resolution.super_Tuple2<pbrt::Point2,_int>.x);
            }
            lVar8 = auStack_88._8_8_ + 1;
          } while (lVar8 < (this_02->image).resolution.super_Tuple2<pbrt::Point2,_int>.y);
        }
        uStack_a8 = CONCAT44(uStack_a8._4_4_,this_02->scale);
        FVar15 = PortalImageInfiniteLight::Area(this_02);
        fVar14 = FVar15 * (Float)uStack_a8;
        TVar1 = (this_02->image).resolution.super_Tuple2<pbrt::Point2,_int>;
        auVar32._0_4_ = (float)(TVar1.x * TVar1.y);
        auVar19._0_4_ = fVar14 * (float)auStack_98._0_4_;
        auVar19._4_4_ = fVar14 * (float)auStack_98._4_4_;
        auVar19._8_4_ = fVar14 * (float)uStack_90;
        auVar19._12_4_ = fVar14 * uStack_90._4_4_;
        auVar32._4_4_ = auVar32._0_4_;
        auVar32._8_4_ = auVar32._0_4_;
        auVar32._12_4_ = auVar32._0_4_;
        auVar13 = vdivps_avx(auVar19,auVar32);
        auVar20 = vshufpd_avx(auVar13,auVar13,1);
        SVar42.values.values._0_8_ = auVar13._0_8_;
        SVar42.values.values._8_8_ = auVar20._0_8_;
        return (SampledSpectrum)SVar42.values.values;
      }
      SVar43 = UniformInfiniteLight::Phi((UniformInfiniteLight *)this_02,lambda);
      return (array<float,_4>)(array<float,_4>)SVar43;
    }
    auStack_98._0_4_ = (this_02->portal).values[0].super_Tuple3<pbrt::Point3,_float>.y;
    auStack_98._4_4_ = (this_02->portal).values[0].super_Tuple3<pbrt::Point3,_float>.z;
    uStack_a0 = (ulong)auStack_98 >> 0x20;
    if ((int)auStack_98._4_4_ < 1) {
      auVar13 = ZEXT816(0);
    }
    else {
      this_00 = &this_02->portal;
      auStack_88._4_4_ = 0;
      auStack_88._0_4_ = auStack_98._0_4_ & 0x7fffffff;
      uStack_90 = 0;
      auVar38 = ZEXT864(0);
      auStack_88._8_8_ = this_02;
      pPStack_78 = (PortalImageInfiniteLight *)lambda;
      do {
        if (0 < auStack_98._0_4_) {
          pSStack_70 = (SampledWavelengths *)(uStack_90 << 0x20);
          uVar9 = 0;
          do {
            _auStack_58 = auVar38._0_16_;
            iVar10 = 0;
            uStack_a8 = 0;
            FStack_ac = 0.0;
            PVar11.super_Tuple2<pbrt::Point2,_int> =
                 (Tuple2<pbrt::Point2,_int>)((ulong)pSStack_70 | uVar9);
            do {
              FVar15 = Image::GetChannel((Image *)this_00,PVar11,iVar10,(WrapMode2D)0x300000003);
              pFVar7 = (Float *)((long)&uStack_a8 + 4);
              if (iVar10 != 0) {
                if (iVar10 == 1) {
                  pFVar7 = (Float *)&uStack_a8;
                }
                else {
                  pFVar7 = &FStack_ac;
                }
              }
              *pFVar7 = FVar15;
              iVar10 = iVar10 + 1;
            } while (iVar10 != 3);
            this_02 = (PortalImageInfiniteLight *)auStack_88._8_8_;
            auVar13 = vinsertps_avx(ZEXT416(uStack_a8._4_4_),ZEXT416((uint)(Float)uStack_a8),0x10);
            auVar13 = vmaxps_avx(auVar13,_DAT_00565010);
            auVar28 = ZEXT856(auVar13._8_8_);
            auVar20 = vmaxss_avx(ZEXT416((uint)FStack_ac),ZEXT416(0));
            auVar37 = ZEXT856(auVar20._8_8_);
            RStack_68._0_8_ = vmovlps_avx(auVar13);
            RStack_68.b = auVar20._0_4_;
            RGBIlluminantSpectrum::RGBIlluminantSpectrum
                      (&RStack_48,(RGBColorSpace *)(((Image *)(auStack_88._8_8_ + 0xf0))->p8).ptr,
                       &RStack_68);
            SVar43 = RGBIlluminantSpectrum::Sample(&RStack_48,(SampledWavelengths *)pPStack_78);
            auVar34._0_8_ = SVar43.values.values._8_8_;
            auVar34._8_56_ = auVar37;
            auVar23._0_8_ = SVar43.values.values._0_8_;
            auVar23._8_56_ = auVar28;
            auVar13 = vmovlhps_avx(auVar23._0_16_,auVar34._0_16_);
            auVar38 = ZEXT1664(CONCAT412(auVar13._12_4_ + fStack_4c,
                                         CONCAT48(auVar13._8_4_ + fStack_50,
                                                  CONCAT44(auVar13._4_4_ + (float)auStack_58._4_4_,
                                                           auVar13._0_4_ + (float)auStack_58._0_4_))
                                        ));
            uVar9 = uVar9 + 1;
          } while (uVar9 != auStack_88._0_8_);
        }
        auVar13 = auVar38._0_16_;
        uStack_90 = uStack_90 + 1;
      } while (uStack_90 != uStack_a0);
    }
    fVar14 = *(float *)&(this_02->image).p16.alloc.memoryResource;
    fVar14 = fVar14 * fVar14 * 39.47842 * *(float *)&(this_02->image).p8.nAlloc;
    auVar30._0_4_ = (float)((int)uStack_a0 * SUB84(auStack_98,0));
    auVar18._0_4_ = fVar14 * auVar13._0_4_;
    auVar18._4_4_ = fVar14 * auVar13._4_4_;
    auVar18._8_4_ = fVar14 * auVar13._8_4_;
    auVar18._12_4_ = fVar14 * auVar13._12_4_;
    auVar30._4_4_ = auVar30._0_4_;
    auVar30._8_4_ = auVar30._0_4_;
    auVar30._12_4_ = auVar30._0_4_;
    auVar13 = vdivps_avx(auVar18,auVar30);
    auVar20 = vshufpd_avx(auVar13,auVar13,1);
    SVar41.values.values._0_8_ = auVar13._0_8_;
    SVar41.values.values._8_8_ = auVar20._0_8_;
    return (SampledSpectrum)SVar41.values.values;
  }
  if (2 < uVar4) {
    if (uVar4 == 3) {
      lVar8._0_4_ = (this_02->portal).values[0].super_Tuple3<pbrt::Point3,_float>.y;
      lVar8._4_4_ = (this_02->portal).values[0].super_Tuple3<pbrt::Point3,_float>.z;
      if ((int)lVar8._4_4_ < 1) {
        auVar13 = ZEXT816(0);
        iVar10 = lVar8._4_4_;
      }
      else {
        uStack_a0 = 0;
        auVar39 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar38 = ZEXT864(0);
        pPStack_78 = (PortalImageInfiniteLight *)lambda;
        do {
          uVar6._0_4_ = (this_02->portal).values[0].super_Tuple3<pbrt::Point3,_float>.y;
          uVar6._4_4_ = (this_02->portal).values[0].super_Tuple3<pbrt::Point3,_float>.z;
          if (0 < (int)(undefined4)uVar6) {
            auStack_98._4_4_ = (float)(int)uStack_a0 + 0.5;
            pSStack_70 = (SampledWavelengths *)(uStack_a0 << 0x20);
            uVar9 = 0;
            do {
              auVar5 = auStack_98;
              _auStack_58 = auVar38._0_16_;
              fVar14 = ((float)(int)uVar9 + 0.5) / (float)(int)uVar6;
              fVar16 = (float)auStack_98._4_4_ / (float)(int)((ulong)uVar6 >> 0x20);
              auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar14 * *(float *)((long)&(this_02->image).
                                                                                  p8.nStored + 4))),
                                        ZEXT416((uint)(1.0 - fVar14)),
                                        ZEXT416(*(uint *)((long)&(this_02->image).p8.nAlloc + 4)));
              auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar16 * *(float *)&(this_02->image).p16.
                                                                           alloc.memoryResource)),
                                        ZEXT416((uint)(1.0 - fVar16)),
                                        ZEXT416((uint)(this_02->image).p8.nStored));
              fVar26 = auVar20._0_4_;
              auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar26 * this_02->sceneRadius)),auVar13,
                                        ZEXT416((uint)this_02->scale));
              auVar21 = auVar39._0_16_;
              auVar20 = vfmadd231ss_fma(auVar20,auVar21,
                                        ZEXT416((uint)*(Float *)&(this_02->filename)._M_dataplus.
                                                                 _M_p));
              fVar14 = auVar20._0_4_ + *(float *)((long)&(this_02->filename)._M_dataplus._M_p + 4);
              auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar26 * *(float *)((long)&(this_02->filename
                                                                                  )._M_string_length
                                                                          + 4))),auVar13,
                                        ZEXT416((uint)(this_02->filename)._M_string_length));
              auVar20 = vfmadd231ss_fma(auVar20,auVar21,
                                        ZEXT416(*(uint *)&(this_02->filename).field_2));
              fVar16 = auVar20._0_4_ + *(float *)((long)&(this_02->filename).field_2 + 4);
              auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar26 * *(float *)((long)&(this_02->filename
                                                                                  ).field_2 + 0xc)))
                                        ,auVar13,ZEXT416(*(uint *)((long)&(this_02->filename).
                                                                          field_2 + 8)));
              auVar20 = vfmadd231ss_fma(auVar20,auVar21,
                                        ZEXT416((uint)(this_02->sceneCenter).
                                                      super_Tuple3<pbrt::Point3,_float>.x));
              auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar26 * *(float *)&this_02->field_0x204)),
                                        auVar13,ZEXT416((uint)(this_02->sceneCenter).
                                                              super_Tuple3<pbrt::Point3,_float>.z));
              auVar13 = vfmadd231ss_fma(auVar13,auVar21,ZEXT416(this_02[1].super_LightBase.type));
              fVar26 = auVar13._0_4_ + this_02[1].super_LightBase.renderFromLight.m.m[0][0];
              bVar2 = fVar26 == 1.0;
              fVar27 = auVar20._0_4_ + (this_02->sceneCenter).super_Tuple3<pbrt::Point3,_float>.y;
              fVar12 = (float)((uint)bVar2 * (int)fVar14 + (uint)!bVar2 * (int)(fVar14 / fVar26));
              fVar16 = (float)((uint)bVar2 * (int)fVar16 + (uint)!bVar2 * (int)(fVar16 / fVar26));
              fVar14 = (float)((uint)bVar2 * (int)fVar27 + (uint)!bVar2 * (int)(fVar27 / fVar26));
              fVar16 = fVar14 * fVar14 + fVar12 * fVar12 + fVar16 * fVar16;
              if (fVar16 < 0.0) {
                auStack_88 = ZEXT416((uint)fVar14);
                fVar16 = sqrtf(fVar16);
                fVar14 = auStack_88._0_4_;
              }
              else {
                auVar13 = vsqrtss_avx(ZEXT416((uint)fVar16),ZEXT416((uint)fVar16));
                fVar16 = auVar13._0_4_;
                auStack_98 = auVar5;
              }
              uStack_90._4_4_ = fVar14 / fVar16;
              uStack_90._0_4_ = uStack_90._4_4_ * uStack_90._4_4_;
              iVar10 = 0;
              uStack_a8 = 0;
              FStack_ac = 0.0;
              auStack_88._0_8_ = uVar9;
              PVar11.super_Tuple2<pbrt::Point2,_int> =
                   (Tuple2<pbrt::Point2,_int>)((ulong)pSStack_70 | uVar9);
              do {
                FVar15 = Image::GetChannel((Image *)&this_02->portal,PVar11,iVar10,
                                           (WrapMode2D)0x200000002);
                pFVar7 = (Float *)((long)&uStack_a8 + 4);
                if (iVar10 != 0) {
                  if (iVar10 == 1) {
                    pFVar7 = (Float *)&uStack_a8;
                  }
                  else {
                    pFVar7 = &FStack_ac;
                  }
                }
                *pFVar7 = FVar15;
                iVar10 = iVar10 + 1;
              } while (iVar10 != 3);
              auVar13 = vinsertps_avx(ZEXT416(uStack_a8._4_4_),ZEXT416((uint)(Float)uStack_a8),0x10)
              ;
              auVar13 = vmaxps_avx(auVar13,_DAT_00565010);
              auVar28 = ZEXT856(auVar13._8_8_);
              auVar20 = vmaxss_avx(ZEXT416((uint)FStack_ac),ZEXT816(0) << 0x40);
              auVar37 = ZEXT856(auVar20._8_8_);
              RStack_68._0_8_ = vmovlps_avx(auVar13);
              RStack_68.b = auVar20._0_4_;
              RGBIlluminantSpectrum::RGBIlluminantSpectrum
                        (&RStack_48,(RGBColorSpace *)(this_02->image).p8.ptr,&RStack_68);
              SVar43 = RGBIlluminantSpectrum::Sample(&RStack_48,(SampledWavelengths *)pPStack_78);
              auVar33._0_8_ = SVar43.values.values._8_8_;
              auVar33._8_56_ = auVar37;
              auVar22._0_8_ = SVar43.values.values._0_8_;
              auVar22._8_56_ = auVar28;
              auVar39 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar13 = vmovlhps_avx(auVar22._0_16_,auVar33._0_16_);
              fVar14 = (float)uStack_90 * uStack_90._4_4_;
              auVar38 = ZEXT1664(CONCAT412(fVar14 * auVar13._12_4_ + fStack_4c,
                                           CONCAT48(fVar14 * auVar13._8_4_ + fStack_50,
                                                    CONCAT44(fVar14 * auVar13._4_4_ +
                                                             (float)auStack_58._4_4_,
                                                             fVar14 * auVar13._0_4_ +
                                                             (float)auStack_58._0_4_))));
              uVar9 = auStack_88._0_8_ + 1;
              uVar6._0_4_ = (this_02->portal).values[0].super_Tuple3<pbrt::Point3,_float>.y;
              uVar6._4_4_ = (this_02->portal).values[0].super_Tuple3<pbrt::Point3,_float>.z;
            } while ((long)uVar9 < (long)(int)(undefined4)uVar6);
          }
          auVar13 = auVar38._0_16_;
          uStack_a0 = uStack_a0 + 1;
          lVar8._0_4_ = (this_02->portal).values[0].super_Tuple3<pbrt::Point3,_float>.y;
          lVar8._4_4_ = (this_02->portal).values[0].super_Tuple3<pbrt::Point3,_float>.z;
        } while ((long)uStack_a0 < lVar8 >> 0x20);
        iVar10 = lVar8._4_4_;
      }
      fVar14 = *(float *)&(this_02->image).p8.nAlloc *
               this_02[1].super_LightBase.renderFromLight.mInv.m[0][1];
      auVar29._0_4_ = (float)((int)lVar8 * iVar10);
      auVar17._0_4_ = fVar14 * auVar13._0_4_;
      auVar17._4_4_ = fVar14 * auVar13._4_4_;
      auVar17._8_4_ = fVar14 * auVar13._8_4_;
      auVar17._12_4_ = fVar14 * auVar13._12_4_;
      auVar29._4_4_ = auVar29._0_4_;
      auVar29._8_4_ = auVar29._0_4_;
      auVar29._12_4_ = auVar29._0_4_;
      auVar13 = vdivps_avx(auVar17,auVar29);
      auVar20 = vshufpd_avx(auVar13,auVar13,1);
      SVar40.values.values._0_8_ = auVar13._0_8_;
      SVar40.values.values._8_8_ = auVar20._0_8_;
      return (SampledSpectrum)SVar40.values.values;
    }
    SVar43 = GoniometricLight::Phi((GoniometricLight *)this_02,lambda);
    return (array<float,_4>)(array<float,_4>)SVar43;
  }
  if (uVar4 != 2) {
    fVar14 = (this_02->portal).values[3].super_Tuple3<pbrt::Point3,_float>.y;
    auVar37 = (undefined1  [56])0x0;
    SVar43 = DenselySampledSpectrum::Sample((DenselySampledSpectrum *)&this_02->portal,lambda);
    auVar36._0_8_ = SVar43.values.values._8_8_;
    auVar36._8_56_ = auVar28;
    auVar25._0_8_ = SVar43.values.values._0_8_;
    auVar25._8_56_ = auVar37;
    auVar13 = vmovlhps_avx(auVar25._0_16_,auVar36._0_16_);
    fVar14 = fVar14 * 12.566371;
    fVar16 = fVar14 * auVar13._0_4_;
    fVar26 = fVar14 * auVar13._4_4_;
    auVar13 = CONCAT412(fVar14 * auVar13._12_4_,
                        CONCAT48(fVar14 * auVar13._8_4_,CONCAT44(fVar26,fVar16)));
    auVar13 = vshufpd_avx(auVar13,auVar13,1);
    SVar44.values.values._8_8_ = auVar13._0_8_;
    SVar44.values.values[0] = fVar16;
    SVar44.values.values[1] = fVar26;
    return (SampledSpectrum)SVar44.values.values;
  }
  SVar43 = DistantLight::Phi((DistantLight *)this_02,lambda);
  return (array<float,_4>)(array<float,_4>)SVar43;
}

Assistant:

PBRT_CPU_GPU
    TaggedPointer(const TaggedPointer &t) { bits = t.bits; }